

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  TYPE *pTVar1;
  BinaryAggregateHeap<long,_duckdb::string_t,_duckdb::GreaterThan> *this;
  char *pcVar2;
  Vector *size;
  Vector *this_00;
  STORAGE_TYPE *pSVar3;
  idx_t iVar4;
  TYPE *value;
  idx_t iVar5;
  idx_t i_1;
  ulong uVar6;
  long lVar7;
  Vector *vector;
  HeapEntry<duckdb::string_t> *idx;
  ulong uVar8;
  UnifiedVectorFormat state_format;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  size = (Vector *)ListVector::GetListSize(result);
  lVar7 = 0;
  for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
    iVar5 = iVar4;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      iVar5 = (idx_t)(local_78.sel)->sel_vector[iVar4];
    }
    lVar7 = lVar7 + *(long *)(*(long *)(local_78.data + iVar5 * 8) + 0x10);
  }
  ListVector::Reserve(result,(idx_t)(&size->vector_type + lVar7));
  pTVar1 = (TYPE *)result->data;
  this_00 = ListVector::GetEntry(result);
  for (uVar6 = 0; uVar6 != count; uVar6 = uVar6 + 1) {
    uVar8 = uVar6;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar8 = (ulong)(local_78.sel)->sel_vector[uVar6];
    }
    iVar4 = uVar6 + offset;
    this = *(BinaryAggregateHeap<long,_duckdb::string_t,_duckdb::GreaterThan> **)
            (local_78.data + uVar8 * 8);
    if (((char)this[1].capacity == '\x01') && (pcVar2 = (char *)this->size, pcVar2 != (char *)0x0))
    {
      *(Vector **)&pTVar1[iVar4].value = size;
      pTVar1[iVar4].value.pointer.ptr = pcVar2;
      value = pTVar1;
      pSVar3 = BinaryAggregateHeap<long,_duckdb::string_t,_duckdb::GreaterThan>::SortAndGetHeap
                         (this);
      idx = &pSVar3->second;
      for (uVar8 = 0; vector = (Vector *)(&size->vector_type + uVar8), uVar8 < this->size;
          uVar8 = uVar8 + 1) {
        MinMaxStringValue::Assign((MinMaxStringValue *)this_00,vector,(idx_t)idx,value);
        idx = (HeapEntry<duckdb::string_t> *)((long)(idx + 1) + 8);
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar4);
      vector = size;
    }
    size = vector;
  }
  ListVector::SetListSize(result,(idx_t)size);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}